

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *this,
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *other)

{
  TypedID<(spirv_cross::Types)3> *pTVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)3> *pTVar3;
  size_t sVar4;
  
  if (this != other) {
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size = 0;
    reserve(this,(other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size
           );
    pTVar1 = (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr;
    sVar2 = (other->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size;
    pTVar3 = (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      pTVar3[sVar4].id = pTVar1[sVar4].id;
    }
    (this->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).buffer_size = sVar2;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}